

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_ienv.c
# Opt level: O1

int sp_ienv(int ispec)

{
  int i;
  int local_4;
  
  if (ispec - 1U < 7) {
    return *(int *)(&DAT_0011169c + (ulong)(ispec - 1U) * 4);
  }
  input_error("sp_ienv",&local_4);
  return 0;
}

Assistant:

int
sp_ienv(int ispec)
{
    int i;
    extern int input_error(char *, int *);

    switch (ispec) {
	case 1: return (20);
	case 2: return (10);
	case 3: return (200);
	case 4: return (200);
	case 5: return (100);
        case 6: return (30);
        case 7: return (10);
    }

    /* Invalid value for ISPEC */
    i = 1;
    input_error("sp_ienv", &i);
    return 0;

}